

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sbox.cpp
# Opt level: O0

void __thiscall Sbox::~Sbox(Sbox *this)

{
  Sequence *pSVar1;
  _Map_pointer ppiVar2;
  Sequence *this_00;
  int local_14;
  int i;
  Sbox *this_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    pSVar1 = this->m_tab[local_14];
    if (pSVar1 != (Sequence *)0x0) {
      ppiVar2 = pSVar1[-1].m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      this_00 = pSVar1 + (long)ppiVar2;
      while (pSVar1 != this_00) {
        this_00 = this_00 + -1;
        Sequence::~Sequence(this_00);
      }
      operator_delete__(&pSVar1[-1].m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node,(long)ppiVar2 * 0x58 + 8);
    }
  }
  if (this->m_tab != (Sequence **)0x0) {
    operator_delete__(this->m_tab);
  }
  return;
}

Assistant:

Sbox::~Sbox() {
    for (auto i = 0; i < 4; ++i) {
        delete[] m_tab[i];
    }
    delete[] m_tab;
}